

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleStringTest.cpp
# Opt level: O3

void __thiscall
TEST_SimpleString_BuildStringFromUnsignedInteger_Test::testBody
          (TEST_SimpleString_BuildStringFromUnsignedInteger_Test *this)

{
  bool bVar1;
  UtestShell *pUVar2;
  char *pcVar3;
  char *pcVar4;
  TestTerminator *pTVar5;
  SimpleString SStack_48;
  SimpleString result;
  SimpleString local_28;
  
  StringFrom((uint)&result);
  SimpleString::SimpleString(&SStack_48,"255");
  bVar1 = operator!=(&SStack_48,&result);
  SimpleString::~SimpleString(&SStack_48);
  if (bVar1) {
    bVar1 = operator!=(&result,&result);
    if (bVar1) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1c])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
                 ,0x38c);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((char *)&SStack_48);
    pcVar3 = SimpleString::asCharString(&SStack_48);
    StringFrom(&local_28);
    pcVar4 = SimpleString::asCharString(&local_28);
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar3,pcVar4,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x38c,pTVar5);
    SimpleString::~SimpleString(&local_28);
    SimpleString::~SimpleString(&SStack_48);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    pTVar5 = UtestShell::getCurrentTestTerminator();
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/SimpleStringTest.cpp"
               ,0x38c,pTVar5);
  }
  SimpleString::~SimpleString(&result);
  return;
}

Assistant:

TEST(SimpleString, BuildStringFromUnsignedInteger)
{
    unsigned int i = 0xff;

    SimpleString result = StringFrom(i);
    const char* expected_string = "255";
    CHECK_EQUAL(expected_string, result);
}